

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O3

void __thiscall cmFindBase::NormalizeFindResult(cmFindBase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  PolicyStatus PVar5;
  int iVar6;
  string *psVar7;
  cmake *pcVar8;
  string *psVar9;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string value;
  allocator<char> local_151;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  path local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  path local_a8;
  path local_80;
  path local_58;
  
  PVar5 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0125,false);
  if (PVar5 != NEW) {
    if (this->StoreResultInCache != true) {
      pcVar3 = (this->super_cmFindCommon).Makefile;
      psVar9 = cmMakefile::GetSafeDefinition(pcVar3,&this->VariableName);
      value_02._M_str = (psVar9->_M_dataplus)._M_p;
      value_02._M_len = psVar9->_M_string_length;
      cmMakefile::AddDefinition(pcVar3,&this->VariableName,value_02);
      return;
    }
    if (this->AlreadyInCacheWithoutMetaInfo != true) {
      return;
    }
    pcVar3 = (this->super_cmFindCommon).Makefile;
    paVar1 = &local_110._M_pathname.field_2;
    local_110._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
    psVar9 = &this->VariableName;
    cmMakefile::AddCacheDefinition
              (pcVar3,psVar9,&local_110._M_pathname,(cmValue)&this->VariableDocumentation,
               this->VariableType,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_pathname._M_dataplus._M_p,
                      local_110._M_pathname.field_2._M_allocated_capacity + 1);
    }
    PVar5 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0126,false);
    if (PVar5 != NEW) {
      return;
    }
    bVar4 = cmMakefile::IsNormalDefinitionSet((this->super_cmFindCommon).Makefile,psVar9);
    if (!bVar4) {
      return;
    }
    pcVar3 = (this->super_cmFindCommon).Makefile;
    pcVar8 = cmMakefile::GetCMakeInstance(pcVar3);
    psVar7 = (string *)cmake::GetCacheDefinition(pcVar8,psVar9);
    if (psVar7 == (string *)0x0) {
      psVar7 = &cmValue::Empty_abi_cxx11_;
    }
    value_01._M_str = (psVar7->_M_dataplus)._M_p;
    value_01._M_len = psVar7->_M_string_length;
    cmMakefile::AddDefinition(pcVar3,psVar9,value_01);
    return;
  }
  psVar9 = &this->VariableName;
  psVar7 = (string *)cmMakefile::GetDefinition((this->super_cmFindCommon).Makefile,psVar9);
  paVar1 = &local_150.field_2;
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  if (psVar7 == (string *)0x0) {
    psVar7 = &cmValue::Empty_abi_cxx11_;
  }
  local_150._M_dataplus._M_p = (pointer)paVar1;
  if (psVar7->_M_string_length != 0) {
    pcVar2 = (psVar7->_M_dataplus)._M_p;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar2,pcVar2 + psVar7->_M_string_length);
    cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
              ((cmCMakePath *)&local_80,&local_e8,auto_format);
    pcVar8 = cmMakefile::GetCMakeInstance((this->super_cmFindCommon).Makefile);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    pcVar2 = (pcVar8->CMakeWorkingDirectory)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar2,pcVar2 + (pcVar8->CMakeWorkingDirectory)._M_string_length
              );
    cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
              ((cmCMakePath *)&local_a8,&local_130,generic_format);
    cmCMakePath::Absolute((cmCMakePath *)&local_58,(cmCMakePath *)&local_80,&local_a8);
    cmCMakePath::Normal((cmCMakePath *)&local_110,(cmCMakePath *)&local_58);
    std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
              (&local_c8,&local_110,&local_151);
    std::__cxx11::string::operator=((string *)&local_150,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_110);
    std::filesystem::__cxx11::path::~path(&local_58);
    std::filesystem::__cxx11::path::~path(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    bVar4 = cmsys::SystemTools::FileExists(&local_150,false);
    if (!bVar4) {
      std::__cxx11::string::_M_assign((string *)&local_150);
    }
  }
  if (this->StoreResultInCache == true) {
    if ((local_150._M_string_length == psVar7->_M_string_length) &&
       (((local_150._M_string_length == 0 ||
         (iVar6 = bcmp(local_150._M_dataplus._M_p,(psVar7->_M_dataplus)._M_p,
                       local_150._M_string_length), iVar6 == 0)) &&
        (this->AlreadyInCacheWithoutMetaInfo != true)))) goto LAB_0057d338;
    pcVar8 = cmMakefile::GetCMakeInstance((this->super_cmFindCommon).Makefile);
    cmake::AddCacheEntry
              (pcVar8,psVar9,&local_150,(cmValue)&this->VariableDocumentation,this->VariableType);
    PVar5 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0126,false);
    pcVar3 = (this->super_cmFindCommon).Makefile;
    if (PVar5 != NEW) {
      cmMakefile::RemoveDefinition(pcVar3,psVar9);
      goto LAB_0057d338;
    }
    bVar4 = cmMakefile::IsNormalDefinitionSet(pcVar3,psVar9);
    if (!bVar4) goto LAB_0057d338;
  }
  value_00._M_str = local_150._M_dataplus._M_p;
  value_00._M_len = local_150._M_string_length;
  cmMakefile::AddDefinition((this->super_cmFindCommon).Makefile,psVar9,value_00);
LAB_0057d338:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p,
                    CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                             local_150.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmFindBase::NormalizeFindResult()
{
  if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0125) ==
      cmPolicies::NEW) {
    // ensure the path returned by find_* command is absolute
    const auto& existingValue =
      this->Makefile->GetDefinition(this->VariableName);
    std::string value;
    if (!existingValue->empty()) {
      value =
        cmCMakePath(*existingValue, cmCMakePath::auto_format)
          .Absolute(cmCMakePath(
            this->Makefile->GetCMakeInstance()->GetCMakeWorkingDirectory()))
          .Normal()
          .GenericString();
      // value = cmSystemTools::CollapseFullPath(*existingValue);
      if (!cmSystemTools::FileExists(value, false)) {
        value = *existingValue;
      }
    }

    if (this->StoreResultInCache) {
      // If the user specifies the entry on the command line without a
      // type we should add the type and docstring but keep the original
      // value.
      if (value != *existingValue || this->AlreadyInCacheWithoutMetaInfo) {
        this->Makefile->GetCMakeInstance()->AddCacheEntry(
          this->VariableName, value, this->VariableDocumentation,
          this->VariableType);
        if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0126) ==
            cmPolicies::NEW) {
          if (this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
            this->Makefile->AddDefinition(this->VariableName, value);
          }
        } else {
          // if there was a definition then remove it
          // This is required to ensure same behavior as
          // cmMakefile::AddCacheDefinition.
          this->Makefile->RemoveDefinition(this->VariableName);
        }
      }
    } else {
      // ensure a normal variable is defined.
      this->Makefile->AddDefinition(this->VariableName, value);
    }
  } else {
    // If the user specifies the entry on the command line without a
    // type we should add the type and docstring but keep the original
    // value.
    if (this->StoreResultInCache) {
      if (this->AlreadyInCacheWithoutMetaInfo) {
        this->Makefile->AddCacheDefinition(this->VariableName, "",
                                           this->VariableDocumentation,
                                           this->VariableType);
        if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0126) ==
              cmPolicies::NEW &&
            this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
          this->Makefile->AddDefinition(
            this->VariableName,
            *this->Makefile->GetCMakeInstance()->GetCacheDefinition(
              this->VariableName));
        }
      }
    } else {
      // ensure a normal variable is defined.
      this->Makefile->AddDefinition(
        this->VariableName,
        this->Makefile->GetSafeDefinition(this->VariableName));
    }
  }
}